

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmcAnd.c
# Opt level: O1

Abc_Cex_t * Gia_ManBmcCexGen(Bmc_Mna_t *pMan,Gia_Man_t *p,int iOut)

{
  uint uVar1;
  Vec_Int_t *pVVar2;
  int *piVar3;
  Gia_Man_t *pGVar4;
  Abc_Cex_t *pAVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  long lVar9;
  
  iVar6 = p->nRegs;
  pAVar5 = Abc_CexAlloc(iVar6,p->vCis->nSize - iVar6,iOut / (p->vCos->nSize - iVar6) + 1);
  iVar6 = p->vCos->nSize - p->nRegs;
  pAVar5->iFrame = iOut / iVar6;
  pAVar5->iPo = iOut % iVar6;
  pVVar2 = pMan->vPiMap;
  if (pVVar2->nSize < 1) {
    uVar8 = 0;
  }
  else {
    piVar3 = pVVar2->pArray;
    lVar9 = 0;
    uVar7 = 0xffffffff;
    uVar8 = 0;
    do {
      uVar1 = piVar3[lVar9];
      if ((int)uVar1 < 0) {
        uVar7 = ~uVar1;
      }
      else {
        pGVar4 = pMan->pFrames;
        iVar6 = pGVar4->vCis->nSize;
        if (iVar6 - pGVar4->nRegs <= (int)uVar8) {
          __assert_fail("v < Gia_ManPiNum(p)",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                        ,0x1b2,"Gia_Obj_t *Gia_ManPi(Gia_Man_t *, int)");
        }
        if (((int)uVar8 < 0) || (iVar6 <= (int)uVar8)) {
LAB_00512a72:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                        ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        iVar6 = pGVar4->vCis->pArray[uVar8];
        if (((long)iVar6 < 0) || (pGVar4->nObjs <= iVar6)) {
          __assert_fail("v >= 0 && v < p->nObjs",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                        ,0x1af,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
        }
        if (pMan->vId2Var->nSize <= iVar6) goto LAB_00512a72;
        iVar6 = pMan->vId2Var->pArray[iVar6];
        if (((long)iVar6 < 0) || (pMan->pSat->size <= iVar6)) {
          __assert_fail("v >= 0 && v < s->size",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satSolver.h"
                        ,0xd0,"int sat_solver_var_value(sat_solver *, int)");
        }
        if (pMan->pSat->model[iVar6] == 1) {
          iVar6 = uVar1 + p->nRegs + (p->vCis->nSize - p->nRegs) * uVar7;
          (&pAVar5[1].iPo)[iVar6 >> 5] = (&pAVar5[1].iPo)[iVar6 >> 5] | 1 << ((byte)iVar6 & 0x1f);
        }
        uVar8 = uVar8 + 1;
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 < pVVar2->nSize);
  }
  if (uVar8 != pMan->pFrames->vCis->nSize - pMan->pFrames->nRegs) {
    __assert_fail("iFramePi == Gia_ManPiNum(pMan->pFrames)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcBmcAnd.c"
                  ,0x2f6,"Abc_Cex_t *Gia_ManBmcCexGen(Bmc_Mna_t *, Gia_Man_t *, int)");
  }
  return pAVar5;
}

Assistant:

Abc_Cex_t * Gia_ManBmcCexGen( Bmc_Mna_t * pMan, Gia_Man_t * p, int iOut )
{
    Abc_Cex_t * pCex;
    int i, iObjId, iSatVar, iOrigPi;
    int iFramePi = 0, iFrame = -1;
    pCex = Abc_CexAlloc( Gia_ManRegNum(p), Gia_ManPiNum(p), iOut / Gia_ManPoNum(p) + 1 );
    pCex->iFrame = iOut / Gia_ManPoNum(p);
    pCex->iPo = iOut % Gia_ManPoNum(p);
    // fill in the input values
    Vec_IntForEachEntry( pMan->vPiMap, iOrigPi, i )
    {
        if ( iOrigPi < 0 )
        {
            iFrame = -iOrigPi-1;
            continue;
        }
        // iOrigPi in iFrame of pGia has PI index iFramePi in pMan->pFrames,
        iObjId = Gia_ObjId( pMan->pFrames, Gia_ManPi(pMan->pFrames, iFramePi) );
        iSatVar = Vec_IntEntry( pMan->vId2Var, iObjId );
        if ( sat_solver_var_value(pMan->pSat, iSatVar) )
            Abc_InfoSetBit( pCex->pData, Gia_ManRegNum(p) + Gia_ManPiNum(p) * iFrame + iOrigPi );
        iFramePi++;
    }
    assert( iFramePi == Gia_ManPiNum(pMan->pFrames) );
    return pCex;
}